

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Task *task)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"(");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,task->length);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,task->id);
  std::operator<<(poVar1,")");
  return out;
}

Assistant:

ostream& operator<<(ostream& out, const Task& task){ 
	out << "(" << task.length << ", " << task.id <<")"; 
	return out; 
}